

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  uint uVar1;
  Rep *pRVar2;
  void *pvVar3;
  LogMessage *other;
  ulong uVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar1 = this->current_size_;
  if ((int)uVar1 < 0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x606);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (n) >= (0): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  else if ((ulong)uVar1 != 0) {
    pRVar2 = this->rep_;
    uVar4 = 0;
    do {
      pvVar3 = pRVar2->elements[uVar4];
      uVar4 = uVar4 + 1;
      Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
                ((RepeatedPtrFieldBase *)((long)pvVar3 + 0x10));
      *(undefined8 *)((long)pvVar3 + 0x58) = 0;
      *(undefined8 *)((long)pvVar3 + 0x60) = 0;
      *(undefined8 *)((long)pvVar3 + 0x48) = 0;
      *(undefined8 *)((long)pvVar3 + 0x50) = 0;
      *(undefined8 *)((long)pvVar3 + 0x38) = 0;
      *(undefined8 *)((long)pvVar3 + 0x40) = 0;
      *(undefined8 *)((long)pvVar3 + 0x28) = 0;
      *(undefined8 *)((long)pvVar3 + 0x30) = 0;
    } while (uVar1 != uVar4);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}